

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O2

pair<google::dense_hashtable_iterator<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>,_bool>
* __thiscall
google::
dense_hashtable<std::pair<int_const,DenseIntMap<int>>,int,Hasher,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SelectKey,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>
::insert_noresize<int,int,DenseIntMap<int>>
          (pair<google::dense_hashtable_iterator<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>,_bool>
           *__return_storage_ptr__,
          dense_hashtable<std::pair<int_const,DenseIntMap<int>>,int,Hasher,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SelectKey,google::dense_hash_map<int,DenseIntMap<int>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,DenseIntMap<int>>>>
          *this,int *key,int *args,DenseIntMap<int> *args_1)

{
  long lVar1;
  long lVar2;
  unsigned_long uVar3;
  pair<unsigned_long,_unsigned_long> pVar4;
  
  pVar4 = dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
          ::find_position<int>
                    ((dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
                      *)this,key);
  uVar3 = pVar4.first;
  if (uVar3 == 0xffffffffffffffff) {
    insert_at<int,DenseIntMap<int>>(&__return_storage_ptr__->first,this,pVar4.second,args,args_1);
  }
  else {
    lVar1 = *(long *)(this + 0x68);
    lVar2 = *(long *)(this + 0x58);
    (__return_storage_ptr__->first).ht =
         (dense_hashtable<std::pair<const_int,_DenseIntMap<int>_>,_int,_Hasher,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SelectKey,_google::dense_hash_map<int,_DenseIntMap<int>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_DenseIntMap<int>_>_>_>
          *)this;
    (__return_storage_ptr__->first).pos = (pointer)(uVar3 * 0x58 + lVar1);
    (__return_storage_ptr__->first).end = (pointer)(lVar2 * 0x58 + lVar1);
  }
  __return_storage_ptr__->second = uVar3 == 0xffffffffffffffff;
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> insert_noresize(K&& key, Args&&... args) {
    // First, double-check we're not inserting delkey or emptyval
    assert(settings.use_empty() && "Inserting without empty key");
    assert(!equals(std::forward<K>(key), key_info.empty_key) && "Inserting the empty key");
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) && "Inserting the deleted key");

    const std::pair<size_type, size_type> pos = find_position(key);
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return std::pair<iterator, bool>(
          iterator(this, table + pos.first, table + num_buckets, false),
          false);  // false: we didn't insert
    } else {       // pos.second says where to put it
      return std::pair<iterator, bool>(insert_at(pos.second, std::forward<Args>(args)...), true);
    }
  }